

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68020_rtm(m68k_info *info)

{
  m68k_info *in_RDI;
  cs_m68k_op *op;
  cs_m68k *ext;
  undefined8 in_stack_fffffffffffffff0;
  int immediate;
  
  immediate = (int)((ulong)in_stack_fffffffffffffff0 >> 0x20);
  set_insn_group(in_RDI,M68K_GRP_RET);
  if ((in_RDI->type & 4) == 0) {
    d68000_invalid((m68k_info *)0x387432);
  }
  else {
    build_absolute_jump_with_immediate
              ((m68k_info *)op,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,immediate);
    (in_RDI->extension).operands[0].address_mode = M68K_AM_NONE;
    (in_RDI->extension).operands[0].type = M68K_OP_REG;
    if ((in_RDI->ir & 8) == 0) {
      (in_RDI->extension).operands[0].field_0.reg = (in_RDI->ir & 7) + M68K_REG_D0;
    }
    else {
      (in_RDI->extension).operands[0].field_0.reg = (in_RDI->ir & 7) + M68K_REG_A0;
    }
  }
  return;
}

Assistant:

static void d68020_rtm(m68k_info *info)
{
	cs_m68k* ext;
	cs_m68k_op* op;

	set_insn_group(info, M68K_GRP_RET);

	LIMIT_CPU_TYPES(info, M68020_ONLY);

	build_absolute_jump_with_immediate(info, M68K_INS_RTM, 0, 0);

	ext = &info->extension;
	op = &ext->operands[0];

	op->address_mode = M68K_AM_NONE;
	op->type = M68K_OP_REG;

	if (BIT_3(info->ir)) {
		op->reg = M68K_REG_A0 + (info->ir & 7);
	} else {
		op->reg = M68K_REG_D0 + (info->ir & 7);
	}
}